

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

bool __thiscall MidiInApi::MidiQueue::push(MidiQueue *this,MidiMessage *msg)

{
  uint uVar1;
  bool bVar2;
  uint local_28;
  uint _size;
  uint _front;
  uint _back;
  MidiMessage *msg_local;
  MidiQueue *this_local;
  
  __front = msg;
  msg_local = (MidiMessage *)this;
  uVar1 = size(this,&_size,&local_28);
  bVar2 = uVar1 < this->ringSize - 1;
  if (bVar2) {
    MidiMessage::operator=(this->ring + _size,__front);
    this->back = (this->back + 1) % this->ringSize;
  }
  return bVar2;
}

Assistant:

bool MidiInApi::MidiQueue::push( const MidiInApi::MidiMessage& msg )
{
  // Local stack copies of front/back
  unsigned int _back, _front, _size;

  // Get back/front indexes exactly once and calculate current size
  _size = size( &_back, &_front );

  if ( _size < ringSize-1 )
  {
    ring[_back] = msg;
    back = (back+1)%ringSize;
    return true;
  }

  return false;
}